

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O3

void readvalue(uint8 *base,uint32 typeoffset,uint32 valoffset,MOJOSHADER_effectValue *value,
              MOJOSHADER_effectObject *objects,MOJOSHADER_malloc m,void *d)

{
  MOJOSHADER_symbolType MVar1;
  MOJOSHADER_symbolClass MVar2;
  MOJOSHADER_effectSamplerState *pMVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  void *pvVar7;
  MOJOSHADER_symbolStructMember *pMVar8;
  ulong uVar9;
  MOJOSHADER_effectValue *value_00;
  uint uVar10;
  uint uVar11;
  int *piVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  MOJOSHADER_symbolTypeInfo *pMVar17;
  uint32 *ptr;
  uint *puVar18;
  uint *puVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  MOJOSHADER_symbolType *local_68;
  
  uVar9 = (ulong)typeoffset;
  MVar1 = *(MOJOSHADER_symbolType *)(base + uVar9);
  MVar2 = *(MOJOSHADER_symbolClass *)(base + uVar9 + 4);
  uVar20 = *(uint *)(base + uVar9 + 8);
  uVar13 = *(uint *)(base + uVar9 + 0xc);
  uVar10 = *(uint *)(base + uVar9 + 0x10);
  (value->type).parameter_type = MVar1;
  (value->type).parameter_class = MVar2;
  uVar11 = *(uint *)(base + uVar20);
  if ((ulong)uVar11 == 0) {
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = (char *)(*m)(uVar11,d);
    memcpy(pcVar6,base + (ulong)uVar20 + 4,(ulong)uVar11);
  }
  value->name = pcVar6;
  uVar20 = *(uint *)(base + uVar13);
  if ((ulong)uVar20 == 0) {
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = (char *)(*m)(uVar20,d);
    memcpy(pcVar6,base + (ulong)uVar13 + 4,(ulong)uVar20);
  }
  value->semantic = pcVar6;
  (value->type).elements = uVar10;
  if (MOJOSHADER_SYMCLASS_STRUCT < MVar2) {
    __assert_fail("valclass >= MOJOSHADER_SYMCLASS_SCALAR && valclass <= MOJOSHADER_SYMCLASS_STRUCT"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                  ,0x10f,
                  "void readvalue(const uint8 *, const uint32, const uint32, MOJOSHADER_effectValue *, MOJOSHADER_effectObject *, MOJOSHADER_malloc, void *)"
                 );
  }
  puVar18 = (uint *)(base + valoffset);
  if (MVar2 < MOJOSHADER_SYMCLASS_OBJECT) {
    if (2 < MVar1 - MOJOSHADER_SYMTYPE_BOOL) {
      __assert_fail("type >= MOJOSHADER_SYMTYPE_BOOL && type <= MOJOSHADER_SYMTYPE_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                    ,0x117,
                    "void readvalue(const uint8 *, const uint32, const uint32, MOJOSHADER_effectValue *, MOJOSHADER_effectObject *, MOJOSHADER_malloc, void *)"
                   );
    }
    uVar20 = *(uint *)(base + uVar9 + 0x14);
    uVar13 = *(uint *)(base + uVar9 + 0x18);
    (value->type).columns = uVar20;
    (value->type).rows = uVar13;
    uVar13 = (uVar10 + (uVar10 == 0)) * uVar13;
    value->value_count = uVar13 * 4;
    pvVar7 = (*m)(uVar13 * 0x10,d);
    (value->field_4).values = pvVar7;
    uVar9 = 0;
    memset(pvVar7,0,(ulong)(uVar13 * 0x10));
    if ((uVar13 & 0xfffffff) != 0) {
      uVar20 = uVar20 * 4;
      uVar21 = 0;
      do {
        memcpy((void *)((long)(value->field_4).values + uVar21),(void *)(uVar9 + (long)puVar18),
               (ulong)uVar20);
        uVar21 = uVar21 + 0x10;
        uVar9 = (ulong)((int)uVar9 + uVar20);
      } while (((uVar13 & 0xfffffff) + (uint)((uVar13 & 0xfffffff) == 0)) * 0x10 != uVar21);
    }
  }
  else if (MVar2 == MOJOSHADER_SYMCLASS_OBJECT) {
    if (0xc < MVar1 - MOJOSHADER_SYMTYPE_STRING) {
      __assert_fail("type >= MOJOSHADER_SYMTYPE_STRING && type <= MOJOSHADER_SYMTYPE_VERTEXSHADER",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                    ,0x12d,
                    "void readvalue(const uint8 *, const uint32, const uint32, MOJOSHADER_effectValue *, MOJOSHADER_effectObject *, MOJOSHADER_malloc, void *)"
                   );
    }
    if (((MVar1 == MOJOSHADER_SYMTYPE_SAMPLERCUBE) ||
        ((MVar1 & (MOJOSHADER_SYMTYPE_VERTEXSHADER|MOJOSHADER_SYMTYPE_SAMPLERCUBE)) ==
         MOJOSHADER_SYMTYPE_SAMPLER2D)) ||
       ((MVar1 & (MOJOSHADER_SYMTYPE_VERTEXSHADER|MOJOSHADER_SYMTYPE_SAMPLERCUBE)) ==
        MOJOSHADER_SYMTYPE_SAMPLER)) {
      uVar20 = *puVar18;
      value->value_count = uVar20;
      pvVar7 = (*m)(uVar20 * 0x48,d);
      (value->field_4).values = pvVar7;
      memset(pvVar7,0,(ulong)(uVar20 * 0x48));
      if ((ulong)uVar20 != 0) {
        uVar13 = 0x98967b;
        lVar22 = 0;
        puVar18 = puVar18 + 1;
        do {
          pMVar3 = (value->field_4).valuesSS;
          value_00 = (MOJOSHADER_effectValue *)((long)&(pMVar3->value).name + lVar22);
          if (uVar13 < 4) {
            *(undefined4 *)((long)&pMVar3->type + lVar22) = 0;
            uVar13 = 0;
            readvalue(base,0,0,value_00,objects,m,d);
            puVar19 = puVar18;
          }
          else {
            uVar10 = uVar13 & 0xfffffffc;
            if (uVar10 == 4) {
              puVar19 = puVar18 + 1;
LAB_00129c74:
              uVar11 = 0;
LAB_00129c76:
              uVar10 = 0;
              uVar13 = 0;
            }
            else {
              if (uVar10 == 8) {
                puVar19 = puVar18 + 2;
                goto LAB_00129c74;
              }
              uVar11 = puVar18[2];
              if (uVar10 == 0xc) {
                puVar19 = puVar18 + 3;
                goto LAB_00129c76;
              }
              uVar10 = puVar18[3];
              puVar19 = puVar18 + 4;
              uVar13 = uVar13 - 0x10;
            }
            uVar4 = *puVar18;
            *(uint *)((long)&pMVar3->type + lVar22) = uVar4 & 0xffffff5f;
            readvalue(base,uVar11,uVar10,value_00,objects,m,d);
            if ((uVar4 & 0xffffff5f) == 4) {
              objects[**(int **)((long)&(pMVar3->value).field_4 + lVar22)].type = MVar1;
            }
          }
          lVar22 = lVar22 + 0x48;
          puVar18 = puVar19;
        } while ((ulong)uVar20 * 0x48 != lVar22);
      }
    }
    else {
      uVar10 = uVar10 + (uVar10 == 0);
      value->value_count = uVar10;
      uVar10 = uVar10 * 4;
      pvVar7 = (*m)(uVar10,d);
      (value->field_4).values = pvVar7;
      memcpy(pvVar7,puVar18,(ulong)uVar10);
      if (value->value_count != 0) {
        uVar9 = 0;
        do {
          objects[*(int *)((long)(value->field_4).values + uVar9 * 4)].type = MVar1;
          uVar9 = uVar9 + 1;
        } while (uVar9 < value->value_count);
      }
    }
  }
  else {
    uVar20 = *(uint *)(base + uVar9 + 0x14);
    piVar12 = (int *)(base + uVar9 + 0x18);
    (value->type).member_count = uVar20;
    pMVar8 = (MOJOSHADER_symbolStructMember *)(*m)(uVar20 * 0x28,d);
    (value->type).members = pMVar8;
    if ((value->type).member_count == 0) {
      uVar20 = 0;
    }
    else {
      uVar13 = 0x989667;
      uVar9 = 0;
      lVar22 = 0x20;
      uVar20 = 0;
      do {
        pMVar8 = (value->type).members;
        if (uVar13 < 4) {
          pMVar17 = (MOJOSHADER_symbolTypeInfo *)((long)pMVar8 + lVar22 + -0x18);
          local_68 = (MOJOSHADER_symbolType *)((long)pMVar8 + lVar22 + -0x14);
          *local_68 = MOJOSHADER_SYMTYPE_VOID;
LAB_00129da3:
          pMVar17->parameter_class = MOJOSHADER_SYMCLASS_SCALAR;
          uVar21 = 0;
          uVar4 = 0;
        }
        else {
          *(int *)((long)pMVar8 + lVar22 + -0x14) = *piVar12;
          uVar11 = uVar13 & 0xfffffffc;
          if (uVar11 == 4) {
            piVar12 = piVar12 + 1;
            pMVar17 = &pMVar8[uVar9].info;
            local_68 = &pMVar8[uVar9].info.parameter_type;
            goto LAB_00129da3;
          }
          pMVar17 = (MOJOSHADER_symbolTypeInfo *)((long)pMVar8 + lVar22 + -0x18);
          local_68 = (MOJOSHADER_symbolType *)((long)pMVar8 + lVar22 + -0x14);
          pMVar17->parameter_class = piVar12[1];
          uVar4 = 0;
          if (uVar11 == 8) {
            piVar12 = piVar12 + 2;
            uVar21 = 0;
          }
          else {
            uVar21 = (ulong)(uint)piVar12[2];
            if (uVar11 == 0xc) {
              piVar12 = piVar12 + 3;
            }
            else {
              piVar12 = piVar12 + 4;
              uVar4 = uVar13 - 0x10;
            }
          }
        }
        uVar13 = *(uint *)(base + uVar21);
        if ((ulong)uVar13 == 0) {
          pvVar7 = (void *)0x0;
        }
        else {
          pvVar7 = (*m)(uVar13,d);
          memcpy(pvVar7,base + uVar21 + 4,(ulong)uVar13);
        }
        *(void **)((long)pMVar8 + lVar22 + -0x20) = pvVar7;
        if (uVar4 < 4) {
          *(undefined4 *)((long)pMVar8 + lVar22 + -8) = 0;
          iVar16 = 0;
LAB_00129e5b:
          *(undefined4 *)((long)pMVar8 + lVar22 + -0xc) = 0;
LAB_00129e64:
          uVar13 = 0;
          iVar5 = 0;
        }
        else {
          iVar16 = *piVar12;
          *(int *)((long)pMVar8 + lVar22 + -8) = iVar16;
          if ((uVar4 & 0xfffffffc) == 4) {
            piVar12 = piVar12 + 1;
            goto LAB_00129e5b;
          }
          *(int *)((long)pMVar8 + lVar22 + -0xc) = piVar12[1];
          if ((uVar4 & 0xfffffffc) == 8) {
            piVar12 = piVar12 + 2;
            goto LAB_00129e64;
          }
          iVar5 = piVar12[2];
          piVar12 = piVar12 + 3;
          uVar13 = uVar4 - 0xc;
        }
        *(int *)((long)pMVar8 + lVar22 + -0x10) = iVar5;
        if (MOJOSHADER_SYMCLASS_VECTOR < pMVar17->parameter_class) {
          __assert_fail("mem->info.parameter_class >= MOJOSHADER_SYMCLASS_SCALAR && mem->info.parameter_class <= MOJOSHADER_SYMCLASS_VECTOR"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                        ,0x178,
                        "void readvalue(const uint8 *, const uint32, const uint32, MOJOSHADER_effectValue *, MOJOSHADER_effectObject *, MOJOSHADER_malloc, void *)"
                       );
        }
        if (2 < *local_68 - MOJOSHADER_SYMTYPE_BOOL) {
          __assert_fail("mem->info.parameter_type >= MOJOSHADER_SYMTYPE_BOOL && mem->info.parameter_type <= MOJOSHADER_SYMTYPE_FLOAT"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                        ,0x17a,
                        "void readvalue(const uint8 *, const uint32, const uint32, MOJOSHADER_effectValue *, MOJOSHADER_effectObject *, MOJOSHADER_malloc, void *)"
                       );
        }
        *(undefined4 *)((long)pMVar8 + lVar22 + -4) = 0;
        *(undefined8 *)((long)&pMVar8->name + lVar22) = 0;
        uVar20 = uVar20 + (iVar16 + (uint)(iVar16 == 0)) * iVar5 * 4;
        uVar9 = uVar9 + 1;
        lVar22 = lVar22 + 0x28;
      } while (uVar9 < (value->type).member_count);
    }
    iVar16 = 0;
    (value->type).columns = uVar20;
    iVar14 = uVar10 + (uVar10 == 0);
    (value->type).rows = 1;
    uVar20 = uVar20 * iVar14;
    value->value_count = uVar20;
    uVar20 = uVar20 * 4;
    pvVar7 = (*m)(uVar20,d);
    (value->field_4).values = pvVar7;
    memset(pvVar7,0,(ulong)uVar20);
    uVar20 = (value->type).member_count;
    lVar22 = 0;
    iVar5 = 0;
    uVar13 = uVar20;
    do {
      if (uVar13 == 0) {
        uVar13 = 0;
      }
      else {
        pMVar8 = (value->type).members;
        uVar9 = 0;
        do {
          iVar15 = pMVar8[uVar9].info.elements * pMVar8[uVar9].info.rows;
          if (iVar15 != 0) {
            lVar22 = (long)(int)lVar22;
            uVar20 = pMVar8[uVar9].info.columns;
            do {
              memcpy((void *)(lVar22 * 4 + (long)(value->field_4).values),
                     (void *)((long)piVar12 + (long)iVar5),(ulong)(uVar20 << 2));
              lVar22 = lVar22 + 4;
              pMVar8 = (value->type).members;
              uVar20 = pMVar8[uVar9].info.columns;
              iVar5 = iVar5 + uVar20 * 4;
              iVar15 = iVar15 + -1;
            } while (iVar15 != 0);
            uVar20 = (value->type).member_count;
          }
          uVar9 = uVar9 + 1;
          uVar13 = uVar20;
        } while (uVar9 < uVar20);
      }
      iVar16 = iVar16 + 1;
    } while (iVar16 != iVar14);
  }
  return;
}

Assistant:

static void readvalue(const uint8 *base,
                      const uint32 typeoffset,
                      const uint32 valoffset,
                      MOJOSHADER_effectValue *value,
                      MOJOSHADER_effectObject *objects,
                      MOJOSHADER_malloc m,
                      void *d)
{
    int i, j, k;
    const uint8 *typeptr = base + typeoffset;
    const uint8 *valptr = base + valoffset;
    unsigned int typelen = 9999999;  // !!! FIXME
    const uint32 type = readui32(&typeptr, &typelen);
    const uint32 valclass = readui32(&typeptr, &typelen);
    const uint32 name = readui32(&typeptr, &typelen);
    const uint32 semantic = readui32(&typeptr, &typelen);
    const uint32 numelements = readui32(&typeptr, &typelen);

    value->type.parameter_type = (MOJOSHADER_symbolType) type;
    value->type.parameter_class = (MOJOSHADER_symbolClass) valclass;
    value->name = readstring(base, name, m, d);
    value->semantic = readstring(base, semantic, m, d);
    value->type.elements = numelements;

    /* Class sanity check */
    assert(valclass >= MOJOSHADER_SYMCLASS_SCALAR && valclass <= MOJOSHADER_SYMCLASS_STRUCT);

    if (valclass == MOJOSHADER_SYMCLASS_SCALAR
     || valclass == MOJOSHADER_SYMCLASS_VECTOR
     || valclass == MOJOSHADER_SYMCLASS_MATRIX_ROWS
     || valclass == MOJOSHADER_SYMCLASS_MATRIX_COLUMNS)
    {
        /* These classes only ever contain scalar values */
        assert(type >= MOJOSHADER_SYMTYPE_BOOL && type <= MOJOSHADER_SYMTYPE_FLOAT);

        const uint32 columncount = readui32(&typeptr, &typelen);
        const uint32 rowcount = readui32(&typeptr, &typelen);

        value->type.columns = columncount;
        value->type.rows = rowcount;

        uint32 siz = 4 * rowcount;
        if (numelements > 0)
            siz *= numelements;
        value->value_count = siz;
        siz *= 4;
        value->values = m(siz, d);
        memset(value->values, '\0', siz);
        siz /= 16;
        for (i = 0; i < siz; i++)
            memcpy(value->valuesF + (i << 2), valptr + ((columncount << 2) * i), columncount << 2);
    } // if
    else if (valclass == MOJOSHADER_SYMCLASS_OBJECT)
    {
        /* This class contains either samplers or "objects" */
        assert(type >= MOJOSHADER_SYMTYPE_STRING && type <= MOJOSHADER_SYMTYPE_VERTEXSHADER);

        if (type == MOJOSHADER_SYMTYPE_SAMPLER
         || type == MOJOSHADER_SYMTYPE_SAMPLER1D
         || type == MOJOSHADER_SYMTYPE_SAMPLER2D
         || type == MOJOSHADER_SYMTYPE_SAMPLER3D
         || type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)
        {
            unsigned int vallen = 9999999; // !!! FIXME
            const uint32 numstates = readui32(&valptr, &vallen);

            value->value_count = numstates;

            const uint32 siz = sizeof(MOJOSHADER_effectSamplerState) * numstates;
            value->values = m(siz, d);
            memset(value->values, '\0', siz);

            for (i = 0; i < numstates; i++)
            {
                MOJOSHADER_effectSamplerState *state = &value->valuesSS[i];
                const uint32 stype = readui32(&valptr, &vallen) & ~0xA0;
                /*const uint32 FIXME =*/ readui32(&valptr, &vallen);
                const uint32 statetypeoffset = readui32(&valptr, &vallen);
                const uint32 statevaloffset = readui32(&valptr, &vallen);

                state->type = (MOJOSHADER_samplerStateType) stype;
                readvalue(base, statetypeoffset, statevaloffset,
                          &state->value, objects,
                          m, d);
                if (stype == MOJOSHADER_SAMP_TEXTURE)
                    objects[state->value.valuesI[0]].type = (MOJOSHADER_symbolType) type;
            } // for
        } // if
        else
        {
            uint32 numobjects = 1;
            if (numelements > 0)
                numobjects = numelements;

            value->value_count = numobjects;

            const uint32 siz = 4 * numobjects;
            value->values = m(siz, d);
            memcpy(value->values, valptr, siz);

            for (i = 0; i < value->value_count; i++)
                objects[value->valuesI[i]].type = (MOJOSHADER_symbolType) type;
        } // else
    } // else if
    else if (valclass == MOJOSHADER_SYMCLASS_STRUCT)
    {
        uint32 siz;

        value->type.member_count = readui32(&typeptr, &typelen);
        siz = value->type.member_count * sizeof (MOJOSHADER_symbolStructMember);
        value->type.members = (MOJOSHADER_symbolStructMember *) m(siz, d);

        uint32 structsize = 0;
        for (i = 0; i < value->type.member_count; i++)
        {
            MOJOSHADER_symbolStructMember *mem = &value->type.members[i];

            mem->info.parameter_type = (MOJOSHADER_symbolType) readui32(&typeptr, &typelen);
            mem->info.parameter_class = (MOJOSHADER_symbolClass) readui32(&typeptr, &typelen);

            const uint32 memname = readui32(&typeptr, &typelen);
            /*const uint32 memsemantic =*/ readui32(&typeptr, &typelen);
            mem->name = readstring(base, memname, m, d);

            mem->info.elements = readui32(&typeptr, &typelen);
            mem->info.columns = readui32(&typeptr, &typelen);
            mem->info.rows = readui32(&typeptr, &typelen);

            // !!! FIXME: Nested structs! -flibit
            assert(mem->info.parameter_class >= MOJOSHADER_SYMCLASS_SCALAR
                && mem->info.parameter_class <= MOJOSHADER_SYMCLASS_VECTOR);
            assert(mem->info.parameter_type >= MOJOSHADER_SYMTYPE_BOOL
                && mem->info.parameter_type <= MOJOSHADER_SYMTYPE_FLOAT);
            mem->info.member_count = 0;
            mem->info.members = NULL;

            uint32 memsize = 4 * mem->info.rows;
            if (mem->info.elements > 0)
                memsize *= mem->info.elements;
            structsize += memsize;
        } // for

        value->type.columns = structsize;
        value->type.rows = 1;
        value->value_count = structsize;
        if (numelements > 0)
            value->value_count *= numelements;

        siz = value->value_count * 4;
        value->values = m(siz, d);
        memset(value->values, '\0', siz);
        int dst_offset = 0, src_offset = 0;
        i = 0;
        do
        {
            for (j = 0; j < value->type.member_count; j++)
            {
                siz = value->type.members[j].info.rows * value->type.members[j].info.elements;
                for (k = 0; k < siz; k++)
                {
                    memcpy(value->valuesF + dst_offset,
                           typeptr + src_offset, /* Yes, typeptr. -flibit */
                           value->type.members[j].info.columns << 2);
                    dst_offset += 4;
                    src_offset += value->type.members[j].info.columns << 2;
                } // for
            }
        } while (++i < numelements);
    } // else if
}